

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void anon_unknown.dwarf_1a3010::ReplaceValue
               (VmModule *module,VmValue *value,VmValue *original,VmValue *replacement)

{
  VmInstructionType VVar1;
  VmValue *pVVar2;
  VmValue *pVVar3;
  uint uVar4;
  VmFunction *this;
  VmBlock *pVVar5;
  VmInstruction *inst_00;
  VmValue **ppVVar6;
  VmConstant *pVVar7;
  VmConstant *pVVar8;
  bool bVar9;
  VmValue *local_108;
  VmConstant *target_3;
  VmConstant *offset_3;
  VmConstant *address_3;
  VmConstant *target_2;
  VmConstant *offset_2;
  VmConstant *address_2;
  VmConstant *target_1;
  VmConstant *offset_1;
  VmConstant *address_1;
  VmConstant *target;
  VmConstant *offset;
  VmConstant *address;
  uint i;
  VmInstruction *inst;
  VmInstruction *curr_1;
  VmBlock *block_1;
  VmBlock *block;
  VmBlock *curr;
  VmFunction *function;
  VmValue *replacement_local;
  VmValue *original_local;
  VmValue *value_local;
  VmModule *module_local;
  
  if (original == (VmValue *)0x0) {
    __assert_fail("original",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x3f4,
                  "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  if (replacement != (VmValue *)0x0) {
    this = getType<VmFunction>(value);
    if (this == (VmFunction *)0x0) {
      pVVar5 = getType<VmBlock>(value);
      if (pVVar5 == (VmBlock *)0x0) {
        inst_00 = getType<VmInstruction>(value);
        if (inst_00 == (VmInstruction *)0x0) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x488,
                        "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                       );
        }
        if ((inst_00->cmd != VM_INST_PHI) || (bVar9 = isType<VmConstant>(replacement), !bVar9)) {
          for (address._4_4_ = 0; uVar4 = SmallArray<VmValue_*,_4U>::size(&inst_00->arguments),
              address._4_4_ < uVar4; address._4_4_ = address._4_4_ + 1) {
            ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,address._4_4_);
            if (*ppVVar6 == original) {
              VmValue::AddUse(replacement,&inst_00->super_VmValue);
              ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,address._4_4_);
              *ppVVar6 = replacement;
              VmValue::RemoveUse(original,&inst_00->super_VmValue);
            }
          }
          switch(inst_00->cmd) {
          case VM_INST_LOAD_BYTE:
          case VM_INST_LOAD_SHORT:
          case VM_INST_LOAD_INT:
          case VM_INST_LOAD_FLOAT:
          case VM_INST_LOAD_DOUBLE:
          case VM_INST_LOAD_LONG:
          case VM_INST_LOAD_STRUCT:
          case VM_INST_STORE_BYTE:
          case VM_INST_STORE_SHORT:
          case VM_INST_STORE_INT:
          case VM_INST_STORE_FLOAT:
          case VM_INST_STORE_DOUBLE:
          case VM_INST_STORE_LONG:
          case VM_INST_STORE_STRUCT:
            ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,0);
            pVVar7 = getType<VmConstant>(*ppVVar6);
            if (pVVar7 != (VmConstant *)0x0) {
              ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,1);
              pVVar8 = getType<VmConstant>(*ppVVar6);
              if ((pVVar7->container != (VariableData *)0x0) && (pVVar8->iValue != 0)) {
                pVVar7 = CreateConstantPointer
                                   (module->allocator,(SynBase *)0x0,pVVar7->iValue + pVVar8->iValue
                                    ,pVVar7->container,(pVVar7->super_VmValue).type.structType,true)
                ;
                VVar1 = inst_00->cmd;
                pVVar8 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
                uVar4 = SmallArray<VmValue_*,_4U>::size(&inst_00->arguments);
                if (uVar4 == 3) {
                  ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,2);
                  local_108 = *ppVVar6;
                }
                else {
                  local_108 = (VmValue *)0x0;
                }
                ChangeInstructionTo(module,inst_00,VVar1,&pVVar7->super_VmValue,
                                    &pVVar8->super_VmValue,local_108,(VmValue *)0x0,(VmValue *)0x0,
                                    (uint *)0x0);
              }
            }
            break;
          default:
            break;
          case VM_INST_MEM_COPY:
            ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,0);
            pVVar7 = getType<VmConstant>(*ppVVar6);
            if (pVVar7 != (VmConstant *)0x0) {
              ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,1);
              pVVar8 = getType<VmConstant>(*ppVVar6);
              if ((pVVar7->container != (VariableData *)0x0) && (pVVar8->iValue != 0)) {
                pVVar7 = CreateConstantPointer
                                   (module->allocator,(SynBase *)0x0,pVVar7->iValue + pVVar8->iValue
                                    ,pVVar7->container,(pVVar7->super_VmValue).type.structType,true)
                ;
                VVar1 = inst_00->cmd;
                pVVar8 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
                ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,2);
                pVVar3 = *ppVVar6;
                ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,3);
                pVVar2 = *ppVVar6;
                ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,4);
                ChangeInstructionTo(module,inst_00,VVar1,&pVVar7->super_VmValue,
                                    &pVVar8->super_VmValue,pVVar3,pVVar2,*ppVVar6,(uint *)0x0);
              }
            }
            ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,2);
            pVVar7 = getType<VmConstant>(*ppVVar6);
            if (pVVar7 != (VmConstant *)0x0) {
              ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,3);
              pVVar8 = getType<VmConstant>(*ppVVar6);
              if ((pVVar7->container != (VariableData *)0x0) && (pVVar8->iValue != 0)) {
                pVVar7 = CreateConstantPointer
                                   (module->allocator,(SynBase *)0x0,pVVar7->iValue + pVVar8->iValue
                                    ,pVVar7->container,(pVVar7->super_VmValue).type.structType,true)
                ;
                VVar1 = inst_00->cmd;
                ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,0);
                pVVar3 = *ppVVar6;
                ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,1);
                pVVar2 = *ppVVar6;
                pVVar8 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
                ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,4);
                ChangeInstructionTo(module,inst_00,VVar1,pVVar3,pVVar2,&pVVar7->super_VmValue,
                                    &pVVar8->super_VmValue,*ppVVar6,(uint *)0x0);
              }
            }
            break;
          case VM_INST_ADD_LOAD:
          case VM_INST_SUB_LOAD:
          case VM_INST_MUL_LOAD:
          case VM_INST_DIV_LOAD:
          case VM_INST_POW_LOAD:
          case VM_INST_MOD_LOAD:
          case VM_INST_LESS_LOAD:
          case VM_INST_GREATER_LOAD:
          case VM_INST_LESS_EQUAL_LOAD:
          case VM_INST_GREATER_EQUAL_LOAD:
          case VM_INST_EQUAL_LOAD:
          case VM_INST_NOT_EQUAL_LOAD:
          case VM_INST_SHL_LOAD:
          case VM_INST_SHR_LOAD:
          case VM_INST_BIT_AND_LOAD:
          case VM_INST_BIT_OR_LOAD:
          case VM_INST_BIT_XOR_LOAD:
            ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,1);
            pVVar7 = getType<VmConstant>(*ppVVar6);
            if (pVVar7 != (VmConstant *)0x0) {
              ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,2);
              pVVar8 = getType<VmConstant>(*ppVVar6);
              if ((pVVar7->container != (VariableData *)0x0) && (pVVar8->iValue != 0)) {
                pVVar7 = CreateConstantPointer
                                   (module->allocator,(SynBase *)0x0,pVVar7->iValue + pVVar8->iValue
                                    ,pVVar7->container,(pVVar7->super_VmValue).type.structType,true)
                ;
                VVar1 = inst_00->cmd;
                ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,0);
                pVVar3 = *ppVVar6;
                pVVar8 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
                ppVVar6 = SmallArray<VmValue_*,_4U>::operator[](&inst_00->arguments,3);
                ChangeInstructionTo(module,inst_00,VVar1,pVVar3,&pVVar7->super_VmValue,
                                    &pVVar8->super_VmValue,*ppVVar6,(VmValue *)0x0,(uint *)0x0);
              }
            }
          }
        }
      }
      else {
        for (inst = pVVar5->firstInstruction; inst != (VmInstruction *)0x0; inst = inst->nextSibling
            ) {
          if (inst == (VmInstruction *)original) {
            __assert_fail("curr != original",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x418,
                          "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                         );
          }
          ReplaceValue(module,&inst->super_VmValue,original,replacement);
        }
      }
    }
    else {
      if ((VmBlock *)original == this->firstBlock) {
        VmValue::AddUse(replacement,&this->super_VmValue);
        VmValue::RemoveUse(original,&this->super_VmValue);
      }
      for (block = this->firstBlock; block != (VmBlock *)0x0; block = block->nextSibling) {
        bVar9 = true;
        if (block == (VmBlock *)original) {
          bVar9 = block == this->firstBlock;
        }
        if (!bVar9) {
          __assert_fail("curr != original || curr == function->firstBlock",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x401,
                        "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                       );
        }
        ReplaceValue(module,&block->super_VmValue,original,replacement);
      }
      pVVar5 = getType<VmBlock>(replacement);
      if (pVVar5 != this->firstBlock) {
        VmFunction::DetachBlock(this,pVVar5);
        pVVar5->parent = this;
        pVVar5->nextSibling = this->firstBlock;
        this->firstBlock->prevSibling = pVVar5;
        this->firstBlock = pVVar5;
      }
    }
    return;
  }
  __assert_fail("replacement",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x3f5,
                "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
               );
}

Assistant:

void ReplaceValue(VmModule *module, VmValue *value, VmValue *original, VmValue *replacement)
	{
		assert(original);
		assert(replacement);

		if(VmFunction *function = getType<VmFunction>(value))
		{
			if(original == function->firstBlock)
			{
				replacement->AddUse(function);
				original->RemoveUse(function);
			}

			for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			{
				assert(curr != original || curr == function->firstBlock); // Function can only use first block

				ReplaceValue(module, curr, original, replacement);
			}

			// Move replacement block to first position
			VmBlock *block = getType<VmBlock>(replacement);

			if(block != function->firstBlock)
			{
				function->DetachBlock(block);

				block->parent = function;
				block->nextSibling = function->firstBlock;

				function->firstBlock->prevSibling = block;
				function->firstBlock = block;
			}
		}
		else if(VmBlock *block = getType<VmBlock>(value))
		{
			for(VmInstruction *curr = block->firstInstruction; curr; curr = curr->nextSibling)
			{
				assert(curr != original); // Block doesn't use instructions

				ReplaceValue(module, curr, original, replacement);
			}
		}
		else if(VmInstruction *inst = getType<VmInstruction>(value))
		{
			// Can't replace phi instruction argument with a constant
			if(inst->cmd == VM_INST_PHI && isType<VmConstant>(replacement))
				return;

			for(unsigned i = 0; i < inst->arguments.size(); i++)
			{
				if(inst->arguments[i] == original)
				{
					replacement->AddUse(inst);

					inst->arguments[i] = replacement;

					original->RemoveUse(inst);
				}
			}

			// Legalize constant offset in load/store instruction
			switch(inst->cmd)
			{
			case VM_INST_LOAD_BYTE:
			case VM_INST_LOAD_SHORT:
			case VM_INST_LOAD_INT:
			case VM_INST_LOAD_FLOAT:
			case VM_INST_LOAD_DOUBLE:
			case VM_INST_LOAD_LONG:
			case VM_INST_LOAD_STRUCT:
			case VM_INST_STORE_BYTE:
			case VM_INST_STORE_SHORT:
			case VM_INST_STORE_INT:
			case VM_INST_STORE_FLOAT:
			case VM_INST_STORE_DOUBLE:
			case VM_INST_STORE_LONG:
			case VM_INST_STORE_STRUCT:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[0]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments.size() == 3 ? inst->arguments[2] : NULL, NULL, NULL, NULL);
					}
				}
				break;
			case VM_INST_MEM_COPY:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[0]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[2], inst->arguments[3], inst->arguments[4], NULL);
					}
				}

				if(VmConstant *address = getType<VmConstant>(inst->arguments[2]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[3]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, inst->arguments[0], inst->arguments[1], target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[4], NULL);
					}
				}
				break;
			case VM_INST_ADD_LOAD:
			case VM_INST_SUB_LOAD:
			case VM_INST_MUL_LOAD:
			case VM_INST_DIV_LOAD:
			case VM_INST_POW_LOAD:
			case VM_INST_MOD_LOAD:
			case VM_INST_LESS_LOAD:
			case VM_INST_GREATER_LOAD:
			case VM_INST_LESS_EQUAL_LOAD:
			case VM_INST_GREATER_EQUAL_LOAD:
			case VM_INST_EQUAL_LOAD:
			case VM_INST_NOT_EQUAL_LOAD:
			case VM_INST_SHL_LOAD:
			case VM_INST_SHR_LOAD:
			case VM_INST_BIT_AND_LOAD:
			case VM_INST_BIT_OR_LOAD:
			case VM_INST_BIT_XOR_LOAD:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[1]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[2]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, inst->arguments[0], target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[3], NULL, NULL);
					}
				}
				break;
			default:
				break;
			}
		}
		else
		{
			assert(!"unknown type");
		}
	}